

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  Totals *_totals;
  TestGroupStats *in_RDX;
  GroupInfo *in_RDI;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  GroupInfo *in_stack_ffffffffffffff20;
  undefined1 local_98 [128];
  TestGroupStats *local_18;
  
  local_18 = in_RDX;
  _totals = (Totals *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)&in_RDI[6].groupIndex);
  GroupInfo::GroupInfo
            (in_stack_ffffffffffffff20,&in_RDI->name,(size_t)_totals,
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  (**(code **)(*(long *)in_RDI + 0x58))();
  TestGroupStats::TestGroupStats(local_18,in_RDI,_totals,(bool)in_stack_ffffffffffffff0f);
  (**(code **)((_totals->assertions).passed + 0x70))(_totals,local_98);
  TestGroupStats::~TestGroupStats((TestGroupStats *)0x1a9d6f);
  GroupInfo::~GroupInfo((GroupInfo *)0x1a9d79);
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }